

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O0

int bsread(bstring r,bStream *s,int n)

{
  int iVar1;
  int n_local;
  bStream *s_local;
  bstring r_local;
  
  if ((((s == (bStream *)0x0) || (s->buff == (bstring)0x0)) || (r == (bstring)0x0)) ||
     ((r->mlen < 1 || (n < 1)))) {
    r_local._4_4_ = -1;
  }
  else {
    iVar1 = balloc(s->buff,s->maxBuffSz + 1);
    if (iVar1 == 0) {
      r->slen = 0;
      r_local._4_4_ = bsreada(r,s,n);
    }
    else {
      r_local._4_4_ = -1;
    }
  }
  return r_local._4_4_;
}

Assistant:

int bsread (bstring r, struct bStream * s, int n) {
	if (s == NULL || s->buff == NULL || r == NULL || r->mlen <= 0
	 || n <= 0) return BSTR_ERR;
	if (BSTR_OK != balloc (s->buff, s->maxBuffSz + 1)) return BSTR_ERR;
	r->slen = 0;
	return bsreada (r, s, n);
}